

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::ObjectEnd(ParsedScene *this,FileLoc loc)

{
  reference __src;
  reference pvVar1;
  reference pvVar2;
  char *unaff_RBX;
  char (*in_RDI) [10];
  long *in_FS_OFFSET;
  FileLoc *unaff_retaddr;
  char (*in_stack_00000008) [4];
  char (*in_stack_00000010) [23];
  char *in_stack_00000018;
  int in_stack_00000024;
  char *in_stack_00000028;
  char vb;
  LogLevel in_stack_00000034;
  char va;
  char (*in_stack_00000040) [23];
  char *in_stack_00000048;
  GraphicsState *in_stack_ffffffffffffffb8;
  GraphicsState *in_stack_ffffffffffffffc0;
  FileLoc *in_stack_ffffffffffffffc8;
  SceneRepresentation *in_stack_ffffffffffffffd0;
  
  if (*(int *)(in_RDI[0xd6] + 4) == 2) {
    Error<char_const(&)[10]>(unaff_retaddr,unaff_RBX,in_RDI);
  }
  else if (*(int *)(in_RDI[0xd6] + 4) == 0) {
    Error<char_const(&)[10]>(unaff_retaddr,unaff_RBX,in_RDI);
  }
  else if (*(long *)(in_RDI[0x11d] + 6) == 0) {
    SceneRepresentation::ErrorExitDeferred<>
              ((SceneRepresentation *)in_stack_ffffffffffffffc0,(FileLoc *)in_stack_ffffffffffffffb8
               ,(char *)0x9cc808);
  }
  else {
    *(undefined8 *)(in_RDI[0x11d] + 6) = 0;
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::back((vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
            *)in_stack_ffffffffffffffc0);
    GraphicsState::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::pop_back((vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                *)0x9cc84e);
    __src = std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::back
                      ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)
                       in_stack_ffffffffffffffc0);
    memcpy(in_RDI[0xd6] + 8,__src,0x100);
    std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::pop_back
              ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)0x9cc889);
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_ffffffffffffffc0);
    *(value_type *)(in_RDI[0xf0] + 4) = *pvVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9cc8b3);
    *(long *)(*in_FS_OFFSET + -0x68) = *(long *)(*in_FS_OFFSET + -0x68) + 1;
    pvVar2 = std::
             vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                     *)in_stack_ffffffffffffffc0);
    if (pvVar2->first == 't') {
      std::vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
      ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
              *)in_stack_ffffffffffffffc0);
      SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,(FileLoc *)in_stack_ffffffffffffffb8);
    }
    else {
      pvVar2 = std::
               vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
               ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                       *)in_stack_ffffffffffffffc0);
      if (pvVar2->first == 'a') {
        std::
        vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
        back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
              *)in_stack_ffffffffffffffc0);
        SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   (char *)in_stack_ffffffffffffffc0,(FileLoc *)in_stack_ffffffffffffffb8);
      }
      else {
        pvVar2 = std::
                 vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                 ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                         *)in_stack_ffffffffffffffc0);
        if (pvVar2->first != 'o') {
          LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                    (in_stack_00000034,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                     in_stack_00000010,in_stack_00000008,in_stack_00000040,in_stack_00000048,
                     (char (*) [4])loc.filename._M_len,loc.filename._M_str);
        }
      }
    }
    std::vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
    pop_back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
              *)0x9cc9f3);
  }
  return;
}

Assistant:

void ParsedScene::ObjectEnd(FileLoc loc) {
    VERIFY_WORLD("ObjectEnd");
    if (currentInstance == nullptr) {
        ErrorExitDeferred(&loc, "ObjectEnd called outside of instance definition");
        return;
    }
    currentInstance = nullptr;

    // NOTE: Must keep the following consistent with AttributeEnd
    *graphicsState = std::move(pushedGraphicsStates.back());
    pushedGraphicsStates.pop_back();

    curTransform = pushedTransforms.back();
    pushedTransforms.pop_back();
    activeTransformBits = pushedActiveTransformBits.back();
    pushedActiveTransformBits.pop_back();

    ++nObjectInstancesCreated;

    if (pushStack.back().first == 't')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open TransformBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else if (pushStack.back().first == 'a')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open AttributeBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 'o');
    pushStack.pop_back();
}